

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall Diligent::IBuffer::IBuffer(IBuffer *this)

{
  IBuffer *this_local;
  
  IDeviceObject::IDeviceObject(&this->super_IDeviceObject);
  (this->super_IDeviceObject).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_010cd720;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IBuffer, IDeviceObject)
{
#if DILIGENT_CPP_INTERFACE
    /// Returns the buffer description used to create the object
    virtual const BufferDesc& METHOD(GetDesc)() const override = 0;
#endif

    /// Creates a new buffer view

    /// \param [in] ViewDesc - View description. See Diligent::BufferViewDesc for details.
    /// \param [out] ppView - Address of the memory location where the pointer to the view interface will be written to.
    ///
    /// \remarks To create a view addressing the entire buffer, set only BufferViewDesc::ViewType member
    ///          of the ViewDesc structure and leave all other members in their default values.\n
    ///          Buffer view will contain strong reference to the buffer, so the buffer will not be destroyed
    ///          until all views are released.\n
    ///          The function calls AddRef() for the created interface, so it must be released by
    ///          a call to Release() when it is no longer needed.
    VIRTUAL void METHOD(CreateView)(THIS_
                                    const BufferViewDesc REF ViewDesc,
                                    IBufferView** ppView) PURE;

    /// Returns the pointer to the default view.

    /// \param [in] ViewType - Type of the requested view. See Diligent::BUFFER_VIEW_TYPE.
    /// \return Pointer to the interface
    ///
    /// \remarks Default views are only created for structured and raw buffers. As for formatted buffers
    ///          the view format is unknown at buffer initialization time, no default views are created.
    ///
    /// \note The function does not increase the reference counter for the returned interface, so
    ///       Release() must *NOT* be called.
    VIRTUAL  IBufferView* METHOD(GetDefaultView)(THIS_
                                                 BUFFER_VIEW_TYPE ViewType) PURE;

    /// Returns native buffer handle specific to the underlying graphics API

    /// \return A pointer to `ID3D11Resource` interface, for D3D11 implementation\n
    ///         A pointer to `ID3D12Resource` interface, for D3D12 implementation\n
    ///         `VkBuffer` handle, for Vulkan implementation\n
    ///         GL buffer name, for OpenGL implementation\n
    ///         `MtlBuffer`, for Metal implementation\n
    ///         `WGPUBuffer`, for WGPU implementation\n
    VIRTUAL Uint64 METHOD(GetNativeHandle)(THIS) PURE;

    /// Sets the buffer usage state.

    /// \note This method does not perform state transition, but
    ///       resets the internal buffer state to the given value.
    ///       This method should be used after the application finished
    ///       manually managing the buffer state and wants to hand over
    ///       state management back to the engine.
    VIRTUAL void METHOD(SetState)(THIS_
                                  RESOURCE_STATE State) PURE;

    /// Returns the internal buffer state
    VIRTUAL RESOURCE_STATE METHOD(GetState)(THIS) CONST PURE;


    /// Returns the buffer memory properties, see Diligent::MEMORY_PROPERTIES.

    /// The memory properties are only relevant for persistently mapped buffers.
    /// In particular, if the memory is not coherent, an application must call
    /// IBuffer::FlushMappedRange() to make writes by the CPU available to the GPU, and
    /// call IBuffer::InvalidateMappedRange() to make writes by the GPU visible to the CPU.
    VIRTUAL MEMORY_PROPERTIES METHOD(GetMemoryProperties)(THIS) CONST PURE;


    /// Flushes the specified range of non-coherent memory from the host cache to make
    /// it available to the GPU.

    /// \param [in] StartOffset - Offset, in bytes, from the beginning of the buffer to
    ///                           the start of the memory range to flush.
    /// \param [in] Size        - Size, in bytes, of the memory range to flush.
    ///
    /// This method should only be used for persistently-mapped buffers that do not
    /// report MEMORY_PROPERTY_HOST_COHERENT property. After an application modifies
    /// a mapped memory range on the CPU, it must flush the range to make it available
    /// to the GPU.
    ///
    /// \note   This method must never be used for USAGE_DYNAMIC buffers.
    ///
    /// When a mapped buffer is unmapped it is automatically flushed by
    /// the engine if necessary.
    VIRTUAL void METHOD(FlushMappedRange)(THIS_
                                          Uint64 StartOffset,
                                          Uint64 Size) PURE;


    /// Invalidates the specified range of non-coherent memory modified by the GPU to make
    /// it visible to the CPU.

    /// \param [in] StartOffset - Offset, in bytes, from the beginning of the buffer to
    ///                           the start of the memory range to invalidate.
    /// \param [in] Size        - Size, in bytes, of the memory range to invalidate.
    ///
    /// This method should only be used for persistently-mapped buffers that do not
    /// report MEMORY_PROPERTY_HOST_COHERENT property. After an application modifies
    /// a mapped memory range on the GPU, it must invalidate the range to make it visible
    /// to the CPU.
    ///
    /// \note   This method must never be used for USAGE_DYNAMIC buffers.
    ///
    /// When a mapped buffer is unmapped, it is automatically invalidated by
    /// the engine if necessary.
    VIRTUAL void METHOD(InvalidateMappedRange)(THIS_
                                               Uint64 StartOffset,
                                               Uint64 Size) PURE;

    /// Returns the sparse buffer memory properties
    VIRTUAL SparseBufferProperties METHOD(GetSparseProperties)(THIS) CONST PURE;
}